

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

int parseNumber(string *str,int begin,int end)

{
  int iVar1;
  runtime_error *prVar2;
  size_t lastloc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string s;
  
  std::__cxx11::string::substr((ulong)&s,(ulong)str);
  if ((begin < end) && ((int)(str->_M_dataplus)._M_p[begin] - 0x30U < 10)) {
    iVar1 = std::__cxx11::stoi(&s,&lastloc,10);
    if (lastloc == (long)(end - begin)) {
      std::__cxx11::string::~string((string *)&s);
      return iVar1;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"expected the entire string ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
    std::operator+(&local_60,&local_80," to be a number");
    std::runtime_error::runtime_error(prVar2,(string *)&local_60);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,"expected the entire string ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
  std::operator+(&local_60,&local_80," to be a number");
  std::runtime_error::runtime_error(prVar2,(string *)&local_60);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int parseNumber(const std::string &str, int begin, int end)
{
  std::string s { str.substr(begin, end-begin) };
  if ((begin < end) and isdigit(str[begin])) {
    //    std::cout << "found number at: " << begin << " and " << end << std::endl;
    size_t lastloc;
    int a = std::stoi(s, &lastloc, 10); // Not correct yet:  "23(a+b)" return val will be 2
    if (lastloc != end-begin)
      throw std::runtime_error("expected the entire string " + s + " to be a number");
    return a;
  }
  throw std::runtime_error("expected the entire string " + s + " to be a number");
}